

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d717::VectorMerge<long_double>::VectorMerge
          (VectorMerge<long_double> *this,int insert_point,int input_length,int insert_length,
          bool recursive,bool overwrite_mode,istream *insert_stream)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  VectorMergeInterface *in_RDI;
  undefined1 in_R8B;
  undefined1 in_R9B;
  int *unaff_retaddr;
  undefined4 local_5c;
  int local_4c;
  istream *in_stack_ffffffffffffffd8;
  vector<long_double,_std::allocator<long_double>_> *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  uVar2 = CONCAT13(in_R8B,in_stack_ffffffffffffffe8) & 0x1ffffff;
  uVar2 = CONCAT13((char)(uVar2 >> 0x18),CONCAT12(in_R9B,(short)uVar2)) & 0xff01ffff;
  VectorMergeInterface::VectorMergeInterface(in_RDI);
  in_RDI->_vptr_VectorMergeInterface = (_func_int **)&PTR__VectorMerge_00137cb8;
  *(undefined4 *)&in_RDI[1]._vptr_VectorMergeInterface = in_ESI;
  *(int *)((long)&in_RDI[1]._vptr_VectorMergeInterface + 4) = in_EDX;
  *(int *)&in_RDI[2]._vptr_VectorMergeInterface = in_ECX;
  if ((uVar2 & 0x10000) == 0) {
    local_4c = *(int *)((long)&in_RDI[1]._vptr_VectorMergeInterface + 4) +
               *(int *)&in_RDI[2]._vptr_VectorMergeInterface;
  }
  else {
    local_4c = *(int *)((long)&in_RDI[1]._vptr_VectorMergeInterface + 4);
  }
  *(int *)((long)&in_RDI[2]._vptr_VectorMergeInterface + 4) = local_4c;
  *(int *)&in_RDI[3]._vptr_VectorMergeInterface =
       (*(int *)((long)&in_RDI[2]._vptr_VectorMergeInterface + 4) -
       *(int *)&in_RDI[1]._vptr_VectorMergeInterface) -
       *(int *)&in_RDI[2]._vptr_VectorMergeInterface;
  if ((uVar2 & 0x10000) == 0) {
    local_5c = 0;
  }
  else {
    local_5c = *(undefined4 *)&in_RDI[2]._vptr_VectorMergeInterface;
  }
  *(undefined4 *)((long)&in_RDI[3]._vptr_VectorMergeInterface + 4) = local_5c;
  *(byte *)&in_RDI[4]._vptr_VectorMergeInterface = (byte)(uVar2 >> 0x18) & 1;
  *(undefined1 *)((long)&in_RDI[4]._vptr_VectorMergeInterface + 1) = 0;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x108698);
  if ((((ulong)in_RDI[4]._vptr_VectorMergeInterface & 1) != 0) &&
     (bVar1 = sptk::ReadStream<long_double>
                        (SUB41((uint)in_ESI >> 0x10,0),in_EDX,in_ECX,uVar2,in_stack_ffffffffffffffe0
                         ,in_stack_ffffffffffffffd8,unaff_retaddr), bVar1)) {
    *(undefined1 *)((long)&in_RDI[4]._vptr_VectorMergeInterface + 1) = 1;
  }
  return;
}

Assistant:

VectorMerge(int insert_point, int input_length, int insert_length,
              bool recursive, bool overwrite_mode,
              std::istream* insert_stream = NULL)
      : insert_point_(insert_point),
        input_length_(input_length),
        insert_length_(insert_length),
        merged_length_(overwrite_mode ? input_length_
                                      : input_length_ + insert_length_),
        input_rest_length_(merged_length_ - insert_point_ - insert_length_),
        input_skip_length_(overwrite_mode ? insert_length_ : 0),
        recursive_(recursive),
        has_vector_(false) {
    if (recursive_ && sptk::ReadStream(false, 0, 0, insert_length_,
                                       &insert_vector_, insert_stream, NULL)) {
      has_vector_ = true;
    }
  }